

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Remove_Module(FT_Library library,FT_Module module)

{
  FT_Memory pFVar1;
  FT_Module_Class *pFVar2;
  FT_Library pFVar3;
  FT_Memory pFVar4;
  FT_ListNode pFVar5;
  FT_ListNode pFVar6;
  FT_Library pFVar7;
  FT_Module_Destructor p_Var8;
  ulong uVar9;
  FT_Renderer_conflict pFVar10;
  FT_Module *ppFVar11;
  FT_ListNode pFVar12;
  FT_ListRec *pFVar13;
  FT_ListNode pFVar14;
  FT_Renderer_conflict render;
  bool bVar15;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (module != (FT_Module)0x0) {
    uVar9 = (ulong)library->num_modules;
    bVar15 = uVar9 != 0;
    if (bVar15) {
      if (library->modules[0] == module) {
        ppFVar11 = library->modules;
      }
      else {
        ppFVar11 = library->modules;
        do {
          ppFVar11 = ppFVar11 + 1;
          bVar15 = ppFVar11 < library->modules + uVar9;
          if (!bVar15) {
            return 0x22;
          }
        } while (*ppFVar11 != module);
      }
      library->num_modules = library->num_modules - 1;
      for (; ppFVar11 < library->modules + (uVar9 - 1); ppFVar11 = ppFVar11 + 1) {
        *ppFVar11 = ppFVar11[1];
      }
      library->modules[uVar9 - 1] = (FT_Module)0x0;
      pFVar1 = module->memory;
      pFVar2 = module->clazz;
      pFVar3 = module->library;
      if ((pFVar3 != (FT_Library)0x0) && (pFVar3->auto_hinter == module)) {
        pFVar3->auto_hinter = (FT_Module)0x0;
      }
      if ((pFVar3 != (FT_Library)0x0) && ((pFVar2->module_flags & 2) != 0)) {
        for (pFVar12 = (pFVar3->renderers).head; pFVar12 != (FT_ListNode)0x0;
            pFVar12 = pFVar12->next) {
          if ((FT_Module)pFVar12->data == module) goto LAB_00135dc8;
        }
        pFVar12 = (FT_ListNode)0x0;
LAB_00135dc8:
        if (pFVar12 != (FT_ListNode)0x0) {
          pFVar4 = pFVar3->memory;
          if (((int)module[1].clazz[1].module_flags == 0x6f75746c) &&
             (module[4].library != (FT_Library)0x0)) {
            (**(code **)((long)module[1].clazz[1].module_interface + 0x28))();
          }
          pFVar5 = pFVar12->prev;
          pFVar6 = pFVar12->next;
          pFVar13 = (FT_ListRec *)&pFVar5->next;
          if (pFVar5 == (FT_ListNode)0x0) {
            pFVar13 = &pFVar3->renderers;
          }
          pFVar13->head = pFVar6;
          pFVar14 = (FT_ListNode)&(pFVar3->renderers).tail;
          if (pFVar6 != (FT_ListNode)0x0) {
            pFVar14 = pFVar6;
          }
          pFVar14->prev = pFVar5;
          (*pFVar4->free)(pFVar4,pFVar12);
          pFVar12 = (pFVar3->renderers).head;
          while ((pFVar10 = (FT_Renderer_conflict)0x0, pFVar12 != (FT_ListNode)0x0 &&
                 (pFVar10 = (FT_Renderer_conflict)pFVar12->data,
                 pFVar10->glyph_format != FT_GLYPH_FORMAT_OUTLINE))) {
            pFVar12 = pFVar12->next;
          }
          pFVar3->cur_renderer = pFVar10;
        }
      }
      if (((module->clazz->module_flags & 1) != 0) &&
         (pFVar4 = module->memory, pFVar4 != (FT_Memory)0x0)) {
        pFVar3 = module[1].library;
        while (pFVar3 != (FT_Library)0x0) {
          pFVar7 = *(FT_Library *)&pFVar3->version_major;
          destroy_face(pFVar4,*(FT_Face *)&pFVar3->version_patch,(FT_Driver)module);
          (*pFVar4->free)(pFVar4,pFVar3);
          pFVar3 = pFVar7;
        }
        module[1].library = (FT_Library)0x0;
        module[1].memory = (FT_Memory)0x0;
      }
      p_Var8 = pFVar2->module_done;
      if (p_Var8 != (FT_Module_Destructor)0x0) {
        (*p_Var8)(module);
      }
      (*pFVar1->free)(pFVar1,module);
      if (bVar15) {
        return 0;
      }
    }
  }
  return 0x22;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Remove_Module( FT_Library  library,
                    FT_Module   module )
  {
    /* try to find the module from the table, then remove it from there */

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( module )
    {
      FT_Module*  cur   = library->modules;
      FT_Module*  limit = cur + library->num_modules;


      for ( ; cur < limit; cur++ )
      {
        if ( cur[0] == module )
        {
          /* remove it from the table */
          library->num_modules--;
          limit--;
          while ( cur < limit )
          {
            cur[0] = cur[1];
            cur++;
          }
          limit[0] = NULL;

          /* destroy the module */
          Destroy_Module( module );

          return FT_Err_Ok;
        }
      }
    }
    return FT_THROW( Invalid_Driver_Handle );
  }